

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O0

void __thiscall
Vault::AppRoleStrategy::AppRoleStrategy(AppRoleStrategy *this,RoleId *roleId,SecretId *secretId)

{
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  SecretId *local_20;
  SecretId *secretId_local;
  RoleId *roleId_local;
  AppRoleStrategy *this_local;
  
  local_20 = secretId;
  secretId_local = (SecretId *)roleId;
  roleId_local = (RoleId *)this;
  AuthenticationStrategy::AuthenticationStrategy(&this->super_AuthenticationStrategy);
  (this->super_AuthenticationStrategy)._vptr_AuthenticationStrategy =
       (_func_int **)&PTR__AppRoleStrategy_0026d3f8;
  Tiny<Vault::RoleIdDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&this->roleId_,roleId);
  Tiny<Vault::SecretIdDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&this->secretId_,secretId);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"approle",&local_41);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&this->mount_,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

explicit AppRoleStrategy(RoleId roleId, SecretId secretId)
      : roleId_(std::move(roleId)), secretId_(std::move(secretId)),
        mount_(Path{"approle"}) {}